

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg-val-math.c
# Opt level: O0

int rtosc_arg_val_sub(rtosc_arg_val_t *lhs,rtosc_arg_val_t *rhs,rtosc_arg_val_t *res)

{
  rtosc_arg_val_t *in_RDX;
  rtosc_arg_val_t *in_RSI;
  rtosc_arg_val_t *in_RDI;
  int local_4;
  
  if (in_RDI->type == in_RSI->type) {
    in_RDX->type = in_RDI->type;
    switch(in_RDI->type) {
    case 'F':
    case 'T':
      in_RDX->type = 'F';
      (in_RDX->val).T = '\0';
      local_4 = 1;
      break;
    default:
      local_4 = 0;
      break;
    case 'c':
    case 'i':
      (in_RDX->val).i = (in_RDI->val).i - (in_RSI->val).i;
      local_4 = 1;
      break;
    case 'd':
      (in_RDX->val).d = (in_RDI->val).d - (in_RSI->val).d;
      local_4 = 1;
      break;
    case 'f':
      (in_RDX->val).f = (in_RDI->val).f - (in_RSI->val).f;
      local_4 = 1;
      break;
    case 'h':
      (in_RDX->val).s = (in_RDI->val).s + -(in_RSI->val).h;
      local_4 = 1;
    }
  }
  else {
    local_4 = rtosc_arg_val_add(in_RDI,in_RSI,in_RDX);
  }
  return local_4;
}

Assistant:

int rtosc_arg_val_sub(const rtosc_arg_val_t* lhs, const rtosc_arg_val_t* rhs,
                      rtosc_arg_val_t* res)
{
    if(lhs->type != rhs->type)
        return rtosc_arg_val_add(lhs, rhs, res);
    res->type = lhs->type;
    switch(lhs->type)
    {
        case 'd': res->val.d = lhs->val.d - rhs->val.d; return true;
        case 'f': res->val.f = lhs->val.f - rhs->val.f; return true;
        case 'h': res->val.h = lhs->val.h - rhs->val.h; return true;
        case 'c':
        case 'i': res->val.i = lhs->val.i - rhs->val.i; return true;
        case 'T':
        case 'F': res->type = 'F'; res->val.T = 0; return true;
        default: return false;
    }
}